

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

_Bool rf_supports_image_file_type(char *filename)

{
  _Bool _Var1;
  _Bool local_11;
  char *filename_local;
  
  _Var1 = rf_is_file_extension(filename,".png");
  local_11 = true;
  if (!_Var1) {
    _Var1 = rf_is_file_extension(filename,".bmp");
    local_11 = true;
    if (!_Var1) {
      _Var1 = rf_is_file_extension(filename,".tga");
      local_11 = true;
      if (!_Var1) {
        _Var1 = rf_is_file_extension(filename,".pic");
        local_11 = true;
        if (!_Var1) {
          _Var1 = rf_is_file_extension(filename,".psd");
          local_11 = true;
          if (!_Var1) {
            local_11 = rf_is_file_extension(filename,".hdr");
          }
        }
      }
    }
  }
  return local_11;
}

Assistant:

RF_API bool rf_supports_image_file_type(const char* filename)
{
    return       rf_is_file_extension(filename, ".png")
              || rf_is_file_extension(filename, ".bmp")
              || rf_is_file_extension(filename, ".tga")
              || rf_is_file_extension(filename, ".pic")
              || rf_is_file_extension(filename, ".psd")
              || rf_is_file_extension(filename, ".hdr");
}